

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SinglyLinkedList.h
# Opt level: O0

string * __thiscall
SinglyLinkedList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
toString(string *__return_storage_ptr__,
        SinglyLinkedList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *n_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  int local_3c;
  node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pnStack_38
  ;
  int i;
  node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *currentNode;
  allocator local_1a;
  undefined1 local_19;
  SinglyLinkedList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_18;
  SinglyLinkedList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  string *output;
  
  local_19 = 0;
  local_18 = this;
  this_local = (SinglyLinkedList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_1a);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  if (this->count == 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"[]\n");
  }
  else {
    pnStack_38 = this->head;
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"[");
    for (local_3c = 0; local_3c < this->count; local_3c = local_3c + 1) {
      if (local_3c == this->count + -1) {
        node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        getData(&local_80,pnStack_38);
        libString::to_string<std::__cxx11::string>(&local_60,(libString *)&local_80,n);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_60);
        std::__cxx11::string::~string((string *)&local_60);
        std::__cxx11::string::~string((string *)&local_80);
      }
      else {
        node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        getData(&local_e0,pnStack_38);
        libString::to_string<std::__cxx11::string>(&local_c0,(libString *)&local_e0,n_00);
        std::operator+(&local_a0,&local_c0,", ");
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_e0);
      }
      pnStack_38 = node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::getNext(pnStack_38);
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"]");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SinglyLinkedList<T>::toString()
{
	std::string output = "";

	if (count == 0)
	{
		output += "[]\n";
	}


	else
	{
		//start at the head of the list.
		node<T> *currentNode = head;
		output += "[";

		int i = 0;

		for (i = 0; i < count; i++)
		{
			if (i == count - 1)
			{
				output += libString::to_string(currentNode->getData());
			}

			else
			{
				output += libString::to_string(currentNode->getData()) + ", ";
			}

			currentNode = currentNode->getNext();
		}

		output += "]";
	}

	return output;
}